

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cc
# Opt level: O3

void __thiscall tcmalloc::Sampler::Init(Sampler *this,uint64_t seed)

{
  int iVar1;
  StaticStorage<SpinLock> *in_RAX;
  char *__nptr;
  ssize_t sVar2;
  bool bVar3;
  SpinLockHolder local_18;
  
  this->rnd_ = seed;
  iVar1 = 0x14;
  do {
    seed = seed * 0x5deece66d + 0xb & 0xffffffffffff;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  this->rnd_ = seed;
  local_18.lock_ = (SpinLock *)in_RAX;
  if (Init::setup_parameter.done_flag_ != 1) {
    local_18.lock_ = (SpinLock *)&Init::setup_parameter.lock_storage_;
    LOCK();
    bVar3 = Init::setup_parameter.lock_storage_.bytes_ == (uint8_t  [4])0x0;
    if (bVar3) {
      Init::setup_parameter.lock_storage_.bytes_[0] = '\x01';
      Init::setup_parameter.lock_storage_.bytes_[1] = '\0';
      Init::setup_parameter.lock_storage_.bytes_[2] = '\0';
      Init::setup_parameter.lock_storage_.bytes_[3] = '\0';
    }
    UNLOCK();
    if (!bVar3) {
      SpinLock::SlowLock((SpinLock *)&Init::setup_parameter.lock_storage_);
    }
    if (Init::setup_parameter.done_flag_ != 1) {
      __nptr = GetenvBeforeMain("TCMALLOC_SAMPLE_PARAMETER");
      if (__nptr == (char *)0x0) {
        FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
        FLAGS_tcmalloc_sample_parameter = 0;
      }
      else {
        FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
        FLAGS_tcmalloc_sample_parameter = strtoll(__nptr,(char **)0x0,10);
      }
      Init::setup_parameter.done_flag_ = 1;
    }
    SpinLockHolder::~SpinLockHolder(&local_18);
  }
  sVar2 = PickNextSamplingPoint(this);
  this->bytes_until_sample_ = sVar2;
  return;
}

Assistant:

void Sampler::Init(uint64_t seed) {
  DCHECK_NE(seed, 0);

  // Initialize PRNG
  rnd_ = seed;
  // Step it forward 20 times for good measure
  for (int i = 0; i < 20; i++) {
    rnd_ = NextRandom(rnd_);
  }

#ifndef NO_TCMALLOC_SAMPLES
  static TrivialOnce setup_parameter;
  setup_parameter.RunOnce([] () {
    const char* val = GetenvBeforeMain("TCMALLOC_SAMPLE_PARAMETER");
    FLAGS_tcmalloc_sample_parameter = tcmalloc::commandlineflags::StringToLongLong(val, 0);
  });
#endif

  // Initialize counter
  bytes_until_sample_ = PickNextSamplingPoint();
}